

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIso.c
# Opt level: O1

void Gia_IsoReportTopmost(Gia_IsoMan_t *p)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  int *piVar5;
  Gia_Man_t *pGVar6;
  word *pwVar7;
  ulong uVar8;
  Gia_Obj_t *pGVar9;
  Vec_Int_t *pVVar10;
  long lVar11;
  ulong uVar12;
  Gia_Obj_t *pGVar13;
  int iVar14;
  long lVar15;
  int *piVar16;
  uint uVar17;
  int iVar18;
  long lVar19;
  
  Gia_ManIncrementTravId(p->pGia);
  pVVar10 = p->vClasses;
  if (1 < pVVar10->nSize) {
    piVar5 = pVVar10->pArray;
    lVar11 = 0;
    do {
      lVar15 = (long)piVar5[lVar11 + 1];
      if (0 < lVar15) {
        iVar14 = piVar5[lVar11];
        pGVar6 = p->pGia;
        pwVar7 = p->pStoreW;
        lVar19 = 0;
        do {
          uVar8 = pwVar7[iVar14 + lVar19];
          if ((long)uVar8 < 0) goto LAB_00714467;
          uVar12 = uVar8 >> 0x20;
          iVar18 = pGVar6->nObjs;
          if (iVar18 <= (int)(uVar8 >> 0x20)) goto LAB_00714467;
          pGVar9 = pGVar6->pObjs;
          uVar8 = *(ulong *)(pGVar9 + uVar12);
          if ((uVar8 & 0x1fffffff) == 0x1fffffff || (int)(uint)uVar8 < 0) {
            if ((((uint)uVar8 & 0x9fffffff) == 0x9fffffff) &&
               (uVar17 = (uint)(uVar8 >> 0x20),
               pGVar6->vCis->nSize - pGVar6->nRegs <= (int)(uVar17 & 0x1fffffff))) {
              uVar17 = uVar17 & 0x1fffffff;
              iVar1 = pGVar6->vCis->nSize;
              if ((int)uVar17 < iVar1 - pGVar6->nRegs) {
                __assert_fail("Gia_ObjIsRo(p, pObj)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/gia.h"
                              ,0x1f8,"Gia_Obj_t *Gia_ObjRoToRi(Gia_Man_t *, Gia_Obj_t *)");
              }
              iVar2 = pGVar6->vCos->nSize;
              uVar17 = (iVar2 - iVar1) + uVar17;
              if (((int)uVar17 < 0) || (iVar2 <= (int)uVar17)) {
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                              ,0x1a7,"int Vec_IntEntry(Vec_Int_t *, int)");
              }
              iVar1 = pGVar6->vCos->pArray[uVar17];
              if ((-1 < (long)iVar1) && (iVar1 < iVar18)) {
                pGVar13 = pGVar9 + iVar1 +
                          -(ulong)((uint)*(undefined8 *)(pGVar9 + iVar1) & 0x1fffffff);
                if ((pGVar9 <= pGVar13) && (pGVar13 < pGVar9 + iVar18)) {
                  iVar18 = (int)((long)pGVar13 - (long)pGVar9 >> 2) * -0x55555555;
                  if (pGVar6->nTravIdsAlloc <= iVar18) goto LAB_007144a5;
                  piVar16 = pGVar6->pTravIds;
                  goto LAB_007142f4;
                }
                goto LAB_00714486;
              }
              goto LAB_00714467;
            }
          }
          else {
            pGVar13 = pGVar9 + (uVar12 - (uVar8 & 0x1fffffff));
            if ((pGVar13 < pGVar9) || (pGVar9 + iVar18 <= pGVar13)) goto LAB_00714486;
            iVar18 = (int)((long)pGVar13 - (long)pGVar9 >> 2) * -0x55555555;
            if (pGVar6->nTravIdsAlloc <= iVar18) {
LAB_007144a5:
              __assert_fail("Gia_ObjId(p, pObj) < p->nTravIdsAlloc",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/gia.h"
                            ,0x25c,"void Gia_ObjSetTravIdCurrent(Gia_Man_t *, Gia_Obj_t *)");
            }
            piVar16 = pGVar6->pTravIds;
            piVar16[iVar18] = pGVar6->nTravIds;
            pGVar13 = pGVar9 + (uVar12 - (*(uint *)&pGVar9[uVar12].field_0x4 & 0x1fffffff));
            if ((pGVar13 < pGVar9) || (pGVar9 + pGVar6->nObjs <= pGVar13)) goto LAB_00714486;
            iVar18 = (int)((long)pGVar13 - (long)pGVar9 >> 2) * -0x55555555;
            if (pGVar6->nTravIdsAlloc <= iVar18) goto LAB_007144a5;
LAB_007142f4:
            piVar16[iVar18] = pGVar6->nTravIds;
          }
          lVar19 = lVar19 + 1;
        } while (lVar15 != lVar19);
      }
      lVar11 = lVar11 + 2;
    } while ((int)((uint)lVar11 | 1) < pVVar10->nSize);
  }
  pVVar10 = p->vClasses;
  if (1 < pVVar10->nSize) {
    lVar11 = 0;
    uVar17 = 0;
    do {
      uVar3 = pVVar10->pArray[lVar11 + 1];
      if (0 < (long)(int)uVar3) {
        uVar4 = pVVar10->pArray[lVar11];
        pGVar6 = p->pGia;
        lVar15 = 0;
        do {
          uVar8 = p->pStoreW[(int)uVar4 + lVar15];
          if ((long)uVar8 < 0) {
LAB_00714467:
            __assert_fail("v >= 0 && v < p->nObjs",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/gia.h"
                          ,0x1cc,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
          }
          iVar14 = (int)(uVar8 >> 0x20);
          if (pGVar6->nObjs <= iVar14) goto LAB_00714467;
          if ((long)pGVar6->nObjs <= (long)(uVar8 >> 0x20)) goto LAB_00714486;
          if (pGVar6->nTravIdsAlloc <= iVar14) {
            __assert_fail("Gia_ObjId(p, pObj) < p->nTravIdsAlloc",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/gia.h"
                          ,0x25e,"int Gia_ObjIsTravIdCurrent(Gia_Man_t *, Gia_Obj_t *)");
          }
          if (*(int *)((long)pGVar6->pTravIds + (uVar8 >> 0x1e & 0x1fffffffc)) != pGVar6->nTravIds)
          {
            pGVar13 = pGVar6->pObjs + (uVar8 >> 0x20);
            uVar17 = uVar17 + 1;
            printf("%5d : ",(ulong)uVar17);
            pGVar9 = p->pGia->pObjs;
            if ((pGVar13 < pGVar9) || (pGVar9 + p->pGia->nObjs <= pGVar13)) {
LAB_00714486:
              __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/gia.h"
                            ,0x1d4,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
            }
            lVar15 = (long)((int)((long)pGVar13 - (long)pGVar9 >> 2) * -0x55555555);
            printf("Obj %6d : Level = %4d.  iBegin = %4d.  Size = %4d.\n",lVar15,
                   (ulong)(uint)p->pLevels[lVar15],(ulong)uVar4,(ulong)uVar3);
            break;
          }
          lVar15 = lVar15 + 1;
        } while ((int)uVar3 != lVar15);
      }
      lVar11 = lVar11 + 2;
      pVVar10 = p->vClasses;
    } while ((int)((uint)lVar11 | 1) < pVVar10->nSize);
  }
  return;
}

Assistant:

void Gia_IsoReportTopmost( Gia_IsoMan_t * p )
{
    Gia_Obj_t * pObj;
    int i, k, iBegin, nSize, Counter = 0;
    // go through equivalence classes
    Gia_ManIncrementTravId( p->pGia );
    Vec_IntForEachEntryDouble( p->vClasses, iBegin, nSize, i )
    {
//        printf( "%d(%d) ", nSize, p->pLevels[Gia_IsoGetItem(p, iBegin)] );
        for ( k = 0; k < nSize; k++ )
        {
            pObj = Gia_ManObj( p->pGia, Gia_IsoGetItem(p, iBegin+k) );
            if ( Gia_ObjIsAnd(pObj) )
            {
                Gia_ObjSetTravIdCurrent( p->pGia, Gia_ObjFanin0(pObj) );
                Gia_ObjSetTravIdCurrent( p->pGia, Gia_ObjFanin1(pObj) );
            }
            else if ( Gia_ObjIsRo(p->pGia, pObj) )
                Gia_ObjSetTravIdCurrent( p->pGia, Gia_ObjFanin0(Gia_ObjRoToRi(p->pGia, pObj)) );
        }
    }
//    printf( "\n" );

    // report non-labeled nodes
    Vec_IntForEachEntryDouble( p->vClasses, iBegin, nSize, i )
    {
        for ( k = 0; k < nSize; k++ )
        {
            pObj = Gia_ManObj( p->pGia, Gia_IsoGetItem(p, iBegin+k) );
            if ( !Gia_ObjIsTravIdCurrent(p->pGia, pObj) )
            {
                printf( "%5d : ", ++Counter );
                printf( "Obj %6d : Level = %4d.  iBegin = %4d.  Size = %4d.\n", 
                    Gia_ObjId(p->pGia, pObj), p->pLevels[Gia_ObjId(p->pGia, pObj)], iBegin, nSize );
                break;
            }
        }
    }
}